

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

OutputFile * __thiscall re2c::OutputFile::wdelay_state_goto(OutputFile *this,uint32_t ind)

{
  OutputBlock *this_00;
  opt_t *poVar1;
  OutputFragment *pOVar2;
  OutputFragment *local_30;
  
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if ((poVar1->fFlag == true) && (bWroteGetState == '\0')) {
    this_00 = (this->blocks).
              super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
    pOVar2 = (OutputFragment *)operator_new(0x188);
    pOVar2->type = STATE_GOTO;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pOVar2->stream);
    pOVar2->indent = ind;
    local_30 = pOVar2;
    std::vector<re2c::OutputFragment*,std::allocator<re2c::OutputFragment*>>::
    emplace_back<re2c::OutputFragment*>
              ((vector<re2c::OutputFragment*,std::allocator<re2c::OutputFragment*>> *)this_00,
               &local_30);
    insert_code(this);
    bWroteGetState = '\x01';
  }
  return this;
}

Assistant:

OutputFile & OutputFile::wdelay_state_goto (uint32_t ind)
{
	if (opts->fFlag && !bWroteGetState)
	{
		blocks.back ()->fragments.push_back (new OutputFragment (OutputFragment::STATE_GOTO, ind));
		insert_code ();
		bWroteGetState = true;
	}
	return *this;
}